

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_algebraic.hpp
# Opt level: O1

Opers __thiscall
chaiscript::Operators::to_operator(Operators *this,string_view t_str,bool t_is_unary)

{
  Operators *pOVar1;
  uint uVar2;
  
  uVar2 = 0x811c9dc5;
  if (this != (Operators *)0x0) {
    pOVar1 = (Operators *)0x0;
    do {
      uVar2 = ((int)(char)pOVar1[t_str._M_len] ^ uVar2) * 0x1000193;
      pOVar1 = pOVar1 + 1;
    } while (this != pOVar1);
  }
  if ((int)uVar2 < 0x10fc6214) {
    if ((int)uVar2 < -0x6f3b5c5) {
      if ((int)uVar2 < -0x6f0b2331) {
        if (uVar2 == 0x8c0cd5e8) {
          return assign_shift_left;
        }
        if (uVar2 == 0x90c1016c) {
          return assign_bitwise_and;
        }
        if (uVar2 == 0x90c34003) {
          return not_equal;
        }
      }
      else if ((int)uVar2 < -0x6a08dcbb) {
        if (uVar2 == 0x90f4dccf) {
          return equals;
        }
        if (uVar2 == 0x94f721b2) {
          return less_than_equal;
        }
      }
      else {
        if (uVar2 == 0x95f72345) {
          return shift_left;
        }
        if (uVar2 == 0xdb0c1b01) {
          return bitwise_xor;
        }
      }
    }
    else if ((int)uVar2 < 0x100edf74) {
      if (uVar2 == 0xf90c4a3b) {
        return bitwise_or;
      }
      if (uVar2 == 0xfb0c4d61) {
        return bitwise_complement;
      }
      if (uVar2 == 0xfedbf213) {
        return pre_increment;
      }
    }
    else if ((int)uVar2 < 0x10cd03df) {
      if (uVar2 == 0x100edf74) {
        return assign_bitwise_xor;
      }
      if (uVar2 == 0x10b97c27) {
        return assign_remainder;
      }
    }
    else {
      if (uVar2 == 0x10cd03df) {
        return assign_difference;
      }
      if (uVar2 == 0x10de4d00) {
        return assign_product;
      }
    }
  }
  else if ((int)uVar2 < 0x280c9438) {
    if ((int)uVar2 < 0x14dc14b5) {
      if (uVar2 == 0x10fc6214) {
        return greater_than_equal;
      }
      if (uVar2 == 0x13fc66cd) {
        return shift_right;
      }
      if (uVar2 == 0x14588772) {
        return assign_bitwise_or;
      }
    }
    else if ((int)uVar2 < 0x20cd1d0f) {
      if (uVar2 == 0x14dc14b5) {
        return assign_sum;
      }
      if (uVar2 == 0x200c87a0) {
        return remainder;
      }
    }
    else {
      if (uVar2 == 0x20cd1d0f) {
        return pre_decrement;
      }
      if (uVar2 == 0x230c8c59) {
        return bitwise_and;
      }
    }
  }
  else if ((int)uVar2 < 0x380cad68) {
    if ((int)uVar2 < 0x2e0c9daa) {
      if (uVar2 == 0x280c9438) {
        return ((uint)t_str._M_str & 0xff) * 2 + difference;
      }
      if (uVar2 == 0x2a0c975e) {
        return quotient;
      }
    }
    else {
      if (uVar2 == 0x2e0c9daa) {
        return ((uint)t_str._M_str & 0xff) * 4 + sum;
      }
      if (uVar2 == 0x2f0c9f3d) {
        return product;
      }
    }
  }
  else if ((int)uVar2 < 0x3b0cb221) {
    if (uVar2 == 0x380cad68) {
      return assign;
    }
    if (uVar2 == 0x390caefb) {
      return less_than;
    }
  }
  else {
    if (uVar2 == 0x3b0cb221) {
      return greater_than;
    }
    if (uVar2 == 0x66560bd0) {
      return assign_shift_right;
    }
  }
  return invalid;
}

Assistant:

constexpr static Opers to_operator(std::string_view t_str, bool t_is_unary = false) noexcept {
#ifdef CHAISCRIPT_MSVC
#pragma warning(push)
#pragma warning(disable : 4307)
#endif

      const auto op_hash = utility::hash(t_str);
      switch (op_hash) {
        case utility::hash("=="): {
          return Opers::equals;
        }
        case utility::hash("<"): {
          return Opers::less_than;
        }
        case utility::hash(">"): {
          return Opers::greater_than;
        }
        case utility::hash("<="): {
          return Opers::less_than_equal;
        }
        case utility::hash(">="): {
          return Opers::greater_than_equal;
        }
        case utility::hash("!="): {
          return Opers::not_equal;
        }
        case utility::hash("="): {
          return Opers::assign;
        }
        case utility::hash("++"): {
          return Opers::pre_increment;
        }
        case utility::hash("--"): {
          return Opers::pre_decrement;
        }
        case utility::hash("*="): {
          return Opers::assign_product;
        }
        case utility::hash("+="): {
          return Opers::assign_sum;
        }
        case utility::hash("-="): {
          return Opers::assign_difference;
        }
        case utility::hash("&="): {
          return Opers::assign_bitwise_and;
        }
        case utility::hash("|="): {
          return Opers::assign_bitwise_or;
        }
        case utility::hash("<<="): {
          return Opers::assign_shift_left;
        }
        case utility::hash(">>="): {
          return Opers::assign_shift_right;
        }
        case utility::hash("%="): {
          return Opers::assign_remainder;
        }
        case utility::hash("^="): {
          return Opers::assign_bitwise_xor;
        }
        case utility::hash("<<"): {
          return Opers::shift_left;
        }
        case utility::hash(">>"): {
          return Opers::shift_right;
        }
        case utility::hash("%"): {
          return Opers::remainder;
        }
        case utility::hash("&"): {
          return Opers::bitwise_and;
        }
        case utility::hash("|"): {
          return Opers::bitwise_or;
        }
        case utility::hash("^"): {
          return Opers::bitwise_xor;
        }
        case utility::hash("~"): {
          return Opers::bitwise_complement;
        }
        case utility::hash("+"): {
          return t_is_unary ? Opers::unary_plus : Opers::sum;
        }
        case utility::hash("-"): {
          return t_is_unary ? Opers::unary_minus : Opers::difference;
        }
        case utility::hash("/"): {
          return Opers::quotient;
        }
        case utility::hash("*"): {
          return Opers::product;
        }
        default: {
          return Opers::invalid;
        }
      }
#ifdef CHAISCRIPT_MSVC
#pragma warning(pop)
#endif
    }